

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nsfe_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Nsfe_File::load_(Nsfe_File *this,Data_Reader *in)

{
  Gme_File *in_RDI;
  blargg_err_t blargg_return_err_;
  Nsf_Emu *in_stack_00000168;
  Data_Reader *in_stack_00000170;
  Nsfe_Info *in_stack_00000178;
  blargg_err_t local_8;
  
  local_8 = Nsfe_Info::load(in_stack_00000178,in_stack_00000170,in_stack_00000168);
  if (local_8 == (blargg_err_t)0x0) {
    Nsfe_Info::disable_playlist((Nsfe_Info *)0x0,SUB81((ulong)in_RDI >> 0x38,0));
    Gme_File::set_track_count(in_RDI,(uint)*(byte *)((long)&in_RDI[2]._vptr_Gme_File + 6));
    local_8 = (blargg_err_t)0x0;
  }
  return local_8;
}

Assistant:

blargg_err_t load_( Data_Reader& in )
	{
		RETURN_ERR( info.load( in, 0 ) );
		info.disable_playlist( false );
		set_track_count( info.info.track_count );
		return 0;
	}